

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator<
               (Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
                *c1,Set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
                    *c2)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  if (c1 != c2) {
    p_Var1 = (c1->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = (c2->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(c2->column_)._M_t._M_impl.super__Rb_tree_header;
    while (((bVar4 = (_Rb_tree_header *)p_Var2 != p_Var3,
            (_Rb_tree_header *)p_Var1 != &(c1->column_)._M_t._M_impl.super__Rb_tree_header &&
            ((_Rb_tree_header *)p_Var2 != p_Var3)) &&
           (bVar4 = *(uint *)(*(long *)(p_Var1 + 1) + 4) < *(uint *)(*(long *)(p_Var2 + 1) + 4),
           *(uint *)(*(long *)(p_Var1 + 1) + 4) == *(uint *)(*(long *)(p_Var2 + 1) + 4)))) {
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool operator<(const Set_column& c1, const Set_column& c2) {
    if (&c1 == &c2) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if ((*it1)->get_row_index() != (*it2)->get_row_index()) return (*it1)->get_row_index() < (*it2)->get_row_index();
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_element() != (*it2)->get_element()) return (*it1)->get_element() < (*it2)->get_element();
      }
      ++it1;
      ++it2;
    }
    return it2 != c2.column_.end();
  }